

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_panel_end(nk_context *ctx)

{
  float *pfVar1;
  nk_window *win;
  nk_panel *pnVar2;
  nk_vec2 nVar3;
  long lVar4;
  bool bVar5;
  nk_rect r;
  nk_rect b_00;
  nk_rect rect;
  nk_rect scroll_00;
  nk_rect scroll_01;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect rect_03;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  nk_color c;
  int iVar10;
  nk_style *style_00;
  nk_command_buffer *b_01;
  float fVar11;
  nk_vec2 nVar12;
  nk_rect r_00;
  float local_10c;
  float local_108;
  bool local_101;
  nk_context *local_100;
  float local_f4;
  float delta_x;
  int left_mouse_click_in_scaler;
  int left_mouse_down;
  nk_vec2 window_size;
  nk_style_item *item;
  nk_rect scaler;
  nk_rect b;
  float padding_y;
  nk_color border_color;
  int any_item_active;
  int is_window_hovered;
  int has_input;
  nk_flags state_1;
  nk_flags state;
  nk_panel *root_panel;
  nk_window *root_window;
  float local_80;
  float scroll_inc;
  float scroll_step;
  float scroll_offset;
  float scroll_target;
  int scroll_has_scrolling;
  nk_rect scroll;
  nk_rect empty_space;
  float local_48;
  float fStack_44;
  nk_vec2 panel_padding;
  nk_vec2 scrollbar_size;
  nk_command_buffer *out;
  nk_style *style;
  nk_panel *layout;
  nk_window *window;
  nk_input *in;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3d83,"void nk_panel_end(struct nk_context *)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3d84,"void nk_panel_end(struct nk_context *)");
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3d85,"void nk_panel_end(struct nk_context *)");
  }
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (ctx->current->layout != (nk_panel *)0x0)) {
    win = ctx->current;
    pnVar2 = win->layout;
    style_00 = &ctx->style;
    b_01 = &win->buffer;
    if (((pnVar2->flags & 0x1000) != 0) || (local_100 = ctx, (pnVar2->flags & 0x400) != 0)) {
      local_100 = (nk_context *)0x0;
    }
    iVar9 = nk_panel_is_sub(pnVar2->type);
    if (iVar9 == 0) {
      r_00.w = 16384.0;
      r_00.h = 16384.0;
      r_00.x = -8192.0;
      r_00.y = -8192.0;
      nk_push_scissor(b_01,r_00);
    }
    nVar3 = (ctx->style).window.scrollbar_size;
    nVar12 = nk_panel_get_padding(style_00,pnVar2->type);
    pnVar2->at_y = (pnVar2->row).height + pnVar2->at_y;
    local_48 = nVar12.x;
    panel_padding.x = nVar3.x;
    panel_padding.y = nVar3.y;
    if (((pnVar2->flags & 0x800) != 0) && ((pnVar2->flags & 0x8000) == 0)) {
      if (pnVar2->at_y < (pnVar2->bounds).y + (pnVar2->bounds).h) {
        (pnVar2->bounds).h = pnVar2->at_y - (pnVar2->bounds).y;
      }
      scroll.w = (win->bounds).x;
      scroll.h = (pnVar2->bounds).y;
      fStack_44 = nVar12.y;
      rect_00.y = scroll.h;
      rect_00.x = scroll.w;
      rect_00.w = (win->bounds).w;
      rect_00.h = fStack_44;
      nk_fill_rect(b_01,rect_00,0.0,(ctx->style).window.background);
      scroll.w = (win->bounds).x;
      scroll.h = (pnVar2->bounds).y;
      rect_01.y = scroll.h;
      rect_01.x = scroll.w;
      rect_01.w = local_48 + pnVar2->border;
      rect_01.h = (pnVar2->bounds).h;
      nk_fill_rect(b_01,rect_01,0.0,(ctx->style).window.background);
      scroll.w = ((pnVar2->bounds).x + (pnVar2->bounds).w) - pnVar2->border;
      scroll.h = (pnVar2->bounds).y;
      empty_space.x = local_48 + pnVar2->border;
      if ((*pnVar2->offset_y == 0) && ((pnVar2->flags & 0x20) == 0)) {
        empty_space.x = panel_padding.x + empty_space.x;
      }
      rect_02.y = scroll.h;
      rect_02.x = scroll.w;
      rect_02.w = empty_space.x;
      rect_02.h = (pnVar2->bounds).h;
      nk_fill_rect(b_01,rect_02,0.0,(ctx->style).window.background);
      if ((*pnVar2->offset_x != 0) && ((pnVar2->flags & 0x20) == 0)) {
        scroll.w = (win->bounds).x;
        scroll.h = (pnVar2->bounds).y + (pnVar2->bounds).h;
        rect_03.y = scroll.h;
        rect_03.x = scroll.w;
        rect_03.w = (win->bounds).w;
        rect_03.h = panel_padding.y;
        nk_fill_rect(b_01,rect_03,0.0,(ctx->style).window.background);
      }
    }
    if ((((pnVar2->flags & 0x20) == 0) && ((pnVar2->flags & 0x8000) == 0)) &&
       (win->scrollbar_hiding_timer <= 4.0 && win->scrollbar_hiding_timer != 4.0)) {
      iVar9 = nk_panel_is_sub(pnVar2->type);
      if (iVar9 == 0) {
        iVar9 = nk_panel_is_sub(pnVar2->type);
        if (iVar9 == 0) {
          local_101 = false;
          if (win == ctx->active) {
            local_101 = pnVar2->has_scrolling != 0;
          }
          scroll_offset = (float)(uint)local_101;
          if (((local_100 == (nk_context *)0x0) ||
              (((local_100->input).mouse.scroll_delta.y <= 0.0 &&
               ((local_100->input).mouse.scroll_delta.x <= 0.0)))) || (scroll_offset == 0.0)) {
            win->scrolled = 0;
          }
          else {
            win->scrolled = 1;
          }
        }
        else {
          scroll_offset = 0.0;
        }
      }
      else {
        for (_state_1 = win->layout; root_panel = (nk_panel *)win,
            _state_1->parent != (nk_panel *)0x0; _state_1 = _state_1->parent) {
        }
        while (lVar4._0_4_ = root_panel[1].bounds.w, lVar4._4_4_ = root_panel[1].bounds.h,
              lVar4 != 0) {
          root_panel = *(nk_panel **)&root_panel[1].bounds.w;
        }
        scroll_offset = 0.0;
        if ((((nk_window *)root_panel == ctx->active) && (pnVar2->has_scrolling != 0)) &&
           ((iVar9 = nk_input_is_mouse_hovering_rect(&local_100->input,pnVar2->bounds), iVar9 != 0
            && (((((_state_1->clip).x <= (pnVar2->bounds).x + (pnVar2->bounds).w &&
                  ((pnVar2->bounds).x <= (_state_1->clip).x + (_state_1->clip).w)) &&
                 ((_state_1->clip).y <= (pnVar2->bounds).y + (pnVar2->bounds).h)) &&
                ((pnVar2->bounds).y <= (_state_1->clip).y + (_state_1->clip).h)))))) {
          for (_state_1 = win->layout; _state_1->parent != (nk_panel *)0x0;
              _state_1 = _state_1->parent) {
            _state_1->has_scrolling = 0;
          }
          _state_1->has_scrolling = 0;
          scroll_offset = 1.4013e-45;
        }
      }
      has_input = 0;
      scroll_target = (pnVar2->bounds).x + (pnVar2->bounds).w + local_48;
      scroll_has_scrolling = (int)(pnVar2->bounds).y;
      scroll.x = panel_padding.x;
      scroll.y = (pnVar2->bounds).h;
      scroll_inc = (float)*pnVar2->offset_y;
      local_80 = scroll.y * 0.1;
      root_window._4_4_ = scroll.y * 0.01;
      scroll_step = (float)(int)(pnVar2->at_y - (float)scroll_has_scrolling);
      scroll_00.y = (float)scroll_has_scrolling;
      scroll_00.x = scroll_target;
      scroll_00.w = panel_padding.x;
      scroll_00.h = scroll.y;
      fVar11 = nk_do_scrollbarv((nk_flags *)&has_input,b_01,scroll_00,(int)scroll_offset,scroll_inc,
                                scroll_step,local_80,root_window._4_4_,&(ctx->style).scrollv,
                                &local_100->input,style_00->font);
      *pnVar2->offset_y = (nk_uint)(long)fVar11;
      if ((local_100 != (nk_context *)0x0) && (scroll_offset != 0.0)) {
        (local_100->input).mouse.scroll_delta.y = 0.0;
      }
      is_window_hovered = 0;
      scroll_target = (pnVar2->bounds).x;
      scroll_has_scrolling = (int)((pnVar2->bounds).y + (pnVar2->bounds).h);
      scroll.x = (pnVar2->bounds).w;
      scroll.y = panel_padding.y;
      scroll_inc = (float)*pnVar2->offset_x;
      scroll_step = (float)(int)(pnVar2->max_x - scroll_target);
      local_80 = pnVar2->max_x * 0.05;
      root_window._4_4_ = pnVar2->max_x * 0.005;
      scroll_01.y = (float)scroll_has_scrolling;
      scroll_01.x = scroll_target;
      scroll_01.w = scroll.x;
      scroll_01.h = panel_padding.y;
      scroll_inc = nk_do_scrollbarh((nk_flags *)&is_window_hovered,b_01,scroll_01,(int)scroll_offset
                                    ,scroll_inc,scroll_step,local_80,root_window._4_4_,
                                    &(ctx->style).scrollh,&local_100->input,style_00->font);
      *pnVar2->offset_x = (nk_uint)(long)scroll_inc;
    }
    if ((win->flags & 0x80) == 0) {
      win->scrollbar_hiding_timer = 0.0;
    }
    else {
      fVar11 = (ctx->input).mouse.delta.x;
      bVar5 = true;
      if ((fVar11 == 0.0) && (!NAN(fVar11))) {
        fVar11 = (ctx->input).mouse.delta.y;
        bVar5 = true;
        if ((fVar11 == 0.0) && (!NAN(fVar11))) {
          bVar5 = (ctx->input).mouse.scroll_delta.y != 0.0;
        }
      }
      iVar9 = nk_window_is_hovered(ctx);
      if (((bVar5) || (iVar9 == 0)) && ((iVar9 != 0 || ((ctx->last_widget_state & 2) != 0)))) {
        win->scrollbar_hiding_timer = 0.0;
      }
      else {
        win->scrollbar_hiding_timer = ctx->delta_time_seconds + win->scrollbar_hiding_timer;
      }
    }
    if ((pnVar2->flags & 1) != 0) {
      c = nk_panel_get_border_color(style_00,pnVar2->type);
      if ((pnVar2->flags & 0x8000) == 0) {
        if ((pnVar2->flags & 0x800) == 0) {
          local_10c = (win->bounds).y + (win->bounds).h;
        }
        else {
          local_10c = (pnVar2->bounds).y + (pnVar2->bounds).h + pnVar2->footer_height;
        }
        local_108 = local_10c;
      }
      else {
        local_108 = (ctx->style).window.border + (win->bounds).y + pnVar2->header_height;
      }
      uVar6 = (win->bounds).x;
      uVar7 = (win->bounds).y;
      uVar8 = (win->bounds).w;
      rect.w = (float)uVar8;
      rect.y = (float)uVar7;
      rect.x = (float)uVar6;
      rect.h = local_108 - (win->bounds).y;
      nk_stroke_rect(b_01,rect,0.0,pnVar2->border,c);
    }
    if ((((pnVar2->flags & 4) != 0) && (local_100 != (nk_context *)0x0)) &&
       ((pnVar2->flags & 0x8000) == 0)) {
      item._4_4_ = (pnVar2->bounds).y + (pnVar2->bounds).h;
      if ((pnVar2->flags & 0x200) == 0) {
        item._0_4_ = (pnVar2->bounds).x + (pnVar2->bounds).w + local_48;
      }
      else {
        item._0_4_ = -local_48 * 0.5 + (pnVar2->bounds).x;
      }
      if ((pnVar2->flags & 0x20) != 0) {
        item._0_4_ = item._0_4_ - panel_padding.x;
      }
      if ((ctx->style).window.scaler.type == NK_STYLE_ITEM_IMAGE) {
        r.y = item._4_4_;
        r.x = item._0_4_;
        r.w = panel_padding.x;
        r.h = panel_padding.y;
        nk_draw_image(b_01,r,&(ctx->style).window.scaler.data.image,(nk_color)0xffffffff);
      }
      else if ((pnVar2->flags & 0x200) == 0) {
        nk_fill_triangle(b_01,item._0_4_ + panel_padding.x,item._4_4_,item._0_4_ + panel_padding.x,
                         item._4_4_ + panel_padding.y,item._0_4_,item._4_4_ + panel_padding.y,
                         (ctx->style).window.scaler.data.color);
      }
      else {
        nk_fill_triangle(b_01,item._0_4_,item._4_4_,item._0_4_,item._4_4_ + panel_padding.y,
                         item._0_4_ + panel_padding.x,item._4_4_ + panel_padding.y,
                         (ctx->style).window.scaler.data.color);
      }
      if ((win->flags & 0x1000) == 0) {
        nVar3 = (ctx->style).window.min_size;
        iVar9 = (local_100->input).mouse.buttons[0].down;
        b_00.y = item._4_4_;
        b_00.x = item._0_4_;
        b_00.w = panel_padding.x;
        b_00.h = panel_padding.y;
        iVar10 = nk_input_has_mouse_click_down_in_rect(&local_100->input,NK_BUTTON_LEFT,b_00,1);
        if ((iVar9 != 0) && (iVar10 != 0)) {
          local_f4 = (local_100->input).mouse.delta.x;
          if ((pnVar2->flags & 0x200) != 0) {
            local_f4 = -local_f4;
            (win->bounds).x = (local_100->input).mouse.delta.x + (win->bounds).x;
          }
          left_mouse_click_in_scaler = (int)nVar3.x;
          if (((float)left_mouse_click_in_scaler <= (win->bounds).w + local_f4) &&
             ((local_f4 < 0.0 ||
              ((0.0 < local_f4 && (item._0_4_ <= (local_100->input).mouse.pos.x)))))) {
            (win->bounds).w = (win->bounds).w + local_f4;
            item._0_4_ = (local_100->input).mouse.delta.x + item._0_4_;
          }
          if ((((pnVar2->flags & 0x800) == 0) &&
              (left_mouse_down = (int)nVar3.y,
              (float)left_mouse_down < (win->bounds).h + (local_100->input).mouse.delta.y)) &&
             ((pfVar1 = &(local_100->input).mouse.delta.y, *pfVar1 <= 0.0 && *pfVar1 != 0.0 ||
              ((0.0 < (local_100->input).mouse.delta.y &&
               (item._4_4_ <= (local_100->input).mouse.pos.y)))))) {
            (win->bounds).h = (win->bounds).h + (local_100->input).mouse.delta.y;
            item._4_4_ = (local_100->input).mouse.delta.y + item._4_4_;
          }
          (ctx->style).cursor_active = (ctx->style).cursors[6];
          (local_100->input).mouse.buttons[0].clicked_pos.x = item._0_4_ + panel_padding.x / 2.0;
          (local_100->input).mouse.buttons[0].clicked_pos.y = item._4_4_ + panel_padding.y / 2.0;
        }
      }
    }
    iVar9 = nk_panel_is_sub(pnVar2->type);
    if (iVar9 == 0) {
      if ((pnVar2->flags & 0x2000) == 0) {
        nk_finish(ctx,win);
      }
      else {
        nk_command_buffer_reset(&win->buffer);
      }
    }
    if ((pnVar2->flags & 0x10000) != 0) {
      pnVar2->flags = pnVar2->flags & 0xffffefff;
      pnVar2->flags = pnVar2->flags & 0xfffeffff;
    }
    win->flags = pnVar2->flags;
    if ((((win->property).active == 0) || ((win->property).old == (win->property).seq)) ||
       ((win->property).active != (win->property).prev)) {
      (win->property).old = (win->property).seq;
      (win->property).prev = (win->property).active;
      (win->property).seq = 0;
    }
    else {
      nk_zero(&win->property,0x68);
    }
    if ((((win->edit).active == 0) || ((win->edit).old == (win->edit).seq)) ||
       ((win->edit).active != (win->edit).prev)) {
      (win->edit).old = (win->edit).seq;
      (win->edit).prev = (win->edit).active;
      (win->edit).seq = 0;
    }
    else {
      nk_zero(&win->edit,0x2c);
    }
    if (((win->popup).active_con == 0) || ((win->popup).con_old == (win->popup).con_count)) {
      (win->popup).con_old = (win->popup).con_count;
      (win->popup).con_count = 0;
    }
    else {
      (win->popup).con_count = 0;
      (win->popup).con_old = 0;
      (win->popup).active_con = 0;
    }
    (win->popup).combo_count = 0;
    if ((pnVar2->row).tree_depth != 0) {
      __assert_fail("!layout->row.tree_depth",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                    ,0x3e9c,"void nk_panel_end(struct nk_context *)");
    }
  }
  return;
}

Assistant:

NK_LIB void
nk_panel_end(struct nk_context *ctx)
{
    struct nk_input *in;
    struct nk_window *window;
    struct nk_panel *layout;
    const struct nk_style *style;
    struct nk_command_buffer *out;

    struct nk_vec2 scrollbar_size;
    struct nk_vec2 panel_padding;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    window = ctx->current;
    layout = window->layout;
    style = &ctx->style;
    out = &window->buffer;
    in = (layout->flags & NK_WINDOW_ROM || layout->flags & NK_WINDOW_NO_INPUT) ? 0 :&ctx->input;
    if (!nk_panel_is_sub(layout->type))
        nk_push_scissor(out, nk_null_rect);

    /* cache configuration data */
    scrollbar_size = style->window.scrollbar_size;
    panel_padding = nk_panel_get_padding(style, layout->type);

    /* update the current cursor Y-position to point over the last added widget */
    layout->at_y += layout->row.height;

    /* dynamic panels */
    if (layout->flags & NK_WINDOW_DYNAMIC && !(layout->flags & NK_WINDOW_MINIMIZED))
    {
        /* update panel height to fit dynamic growth */
        struct nk_rect empty_space;
        if (layout->at_y < (layout->bounds.y + layout->bounds.h))
            layout->bounds.h = layout->at_y - layout->bounds.y;

        /* fill top empty space */
        empty_space.x = window->bounds.x;
        empty_space.y = layout->bounds.y;
        empty_space.h = panel_padding.y;
        empty_space.w = window->bounds.w;
        nk_fill_rect(out, empty_space, 0, style->window.background);

        /* fill left empty space */
        empty_space.x = window->bounds.x;
        empty_space.y = layout->bounds.y;
        empty_space.w = panel_padding.x + layout->border;
        empty_space.h = layout->bounds.h;
        nk_fill_rect(out, empty_space, 0, style->window.background);

        /* fill right empty space */
        empty_space.x = layout->bounds.x + layout->bounds.w - layout->border;
        empty_space.y = layout->bounds.y;
        empty_space.w = panel_padding.x + layout->border;
        empty_space.h = layout->bounds.h;
        if (*layout->offset_y == 0 && !(layout->flags & NK_WINDOW_NO_SCROLLBAR))
            empty_space.w += scrollbar_size.x;
        nk_fill_rect(out, empty_space, 0, style->window.background);

        /* fill bottom empty space */
        if (*layout->offset_x != 0 && !(layout->flags & NK_WINDOW_NO_SCROLLBAR)) {
            empty_space.x = window->bounds.x;
            empty_space.y = layout->bounds.y + layout->bounds.h;
            empty_space.w = window->bounds.w;
            empty_space.h = scrollbar_size.y;
            nk_fill_rect(out, empty_space, 0, style->window.background);
        }
    }

    /* scrollbars */
    if (!(layout->flags & NK_WINDOW_NO_SCROLLBAR) &&
        !(layout->flags & NK_WINDOW_MINIMIZED) &&
        window->scrollbar_hiding_timer < NK_SCROLLBAR_HIDING_TIMEOUT)
    {
        struct nk_rect scroll;
        int scroll_has_scrolling;
        float scroll_target;
        float scroll_offset;
        float scroll_step;
        float scroll_inc;

        /* mouse wheel scrolling */
        if (nk_panel_is_sub(layout->type))
        {
            /* sub-window mouse wheel scrolling */
            struct nk_window *root_window = window;
            struct nk_panel *root_panel = window->layout;
            while (root_panel->parent)
                root_panel = root_panel->parent;
            while (root_window->parent)
                root_window = root_window->parent;

            /* only allow scrolling if parent window is active */
            scroll_has_scrolling = 0;
            if ((root_window == ctx->active) && layout->has_scrolling) {
                /* and panel is being hovered and inside clip rect*/
                if (nk_input_is_mouse_hovering_rect(in, layout->bounds) &&
                    NK_INTERSECT(layout->bounds.x, layout->bounds.y, layout->bounds.w, layout->bounds.h,
                        root_panel->clip.x, root_panel->clip.y, root_panel->clip.w, root_panel->clip.h))
                {
                    /* deactivate all parent scrolling */
                    root_panel = window->layout;
                    while (root_panel->parent) {
                        root_panel->has_scrolling = nk_false;
                        root_panel = root_panel->parent;
                    }
                    root_panel->has_scrolling = nk_false;
                    scroll_has_scrolling = nk_true;
                }
            }
        } else if (!nk_panel_is_sub(layout->type)) {
            /* window mouse wheel scrolling */
            scroll_has_scrolling = (window == ctx->active) && layout->has_scrolling;
            if (in && (in->mouse.scroll_delta.y > 0 || in->mouse.scroll_delta.x > 0) && scroll_has_scrolling)
                window->scrolled = nk_true;
            else window->scrolled = nk_false;
        } else scroll_has_scrolling = nk_false;

        {
            /* vertical scrollbar */
            nk_flags state = 0;
            scroll.x = layout->bounds.x + layout->bounds.w + panel_padding.x;
            scroll.y = layout->bounds.y;
            scroll.w = scrollbar_size.x;
            scroll.h = layout->bounds.h;

            scroll_offset = (float)*layout->offset_y;
            scroll_step = scroll.h * 0.10f;
            scroll_inc = scroll.h * 0.01f;
            scroll_target = (float)(int)(layout->at_y - scroll.y);
            scroll_offset = nk_do_scrollbarv(&state, out, scroll, scroll_has_scrolling,
                scroll_offset, scroll_target, scroll_step, scroll_inc,
                &ctx->style.scrollv, in, style->font);
            *layout->offset_y = (nk_uint)scroll_offset;
            if (in && scroll_has_scrolling)
                in->mouse.scroll_delta.y = 0;
        }
        {
            /* horizontal scrollbar */
            nk_flags state = 0;
            scroll.x = layout->bounds.x;
            scroll.y = layout->bounds.y + layout->bounds.h;
            scroll.w = layout->bounds.w;
            scroll.h = scrollbar_size.y;

            scroll_offset = (float)*layout->offset_x;
            scroll_target = (float)(int)(layout->max_x - scroll.x);
            scroll_step = layout->max_x * 0.05f;
            scroll_inc = layout->max_x * 0.005f;
            scroll_offset = nk_do_scrollbarh(&state, out, scroll, scroll_has_scrolling,
                scroll_offset, scroll_target, scroll_step, scroll_inc,
                &ctx->style.scrollh, in, style->font);
            *layout->offset_x = (nk_uint)scroll_offset;
        }
    }

    /* hide scroll if no user input */
    if (window->flags & NK_WINDOW_SCROLL_AUTO_HIDE) {
        int has_input = ctx->input.mouse.delta.x != 0 || ctx->input.mouse.delta.y != 0 || ctx->input.mouse.scroll_delta.y != 0;
        int is_window_hovered = nk_window_is_hovered(ctx);
        int any_item_active = (ctx->last_widget_state & NK_WIDGET_STATE_MODIFIED);
        if ((!has_input && is_window_hovered) || (!is_window_hovered && !any_item_active))
            window->scrollbar_hiding_timer += ctx->delta_time_seconds;
        else window->scrollbar_hiding_timer = 0;
    } else window->scrollbar_hiding_timer = 0;

    /* window border */
    if (layout->flags & NK_WINDOW_BORDER)
    {
        struct nk_color border_color = nk_panel_get_border_color(style, layout->type);
        const float padding_y = (layout->flags & NK_WINDOW_MINIMIZED)
            ? (style->window.border + window->bounds.y + layout->header_height)
            : ((layout->flags & NK_WINDOW_DYNAMIC)
                ? (layout->bounds.y + layout->bounds.h + layout->footer_height)
                : (window->bounds.y + window->bounds.h));
        struct nk_rect b = window->bounds;
        b.h = padding_y - window->bounds.y;
        nk_stroke_rect(out, b, 0, layout->border, border_color);
    }

    /* scaler */
    if ((layout->flags & NK_WINDOW_SCALABLE) && in && !(layout->flags & NK_WINDOW_MINIMIZED))
    {
        /* calculate scaler bounds */
        struct nk_rect scaler;
        scaler.w = scrollbar_size.x;
        scaler.h = scrollbar_size.y;
        scaler.y = layout->bounds.y + layout->bounds.h;
        if (layout->flags & NK_WINDOW_SCALE_LEFT)
            scaler.x = layout->bounds.x - panel_padding.x * 0.5f;
        else scaler.x = layout->bounds.x + layout->bounds.w + panel_padding.x;
        if (layout->flags & NK_WINDOW_NO_SCROLLBAR)
            scaler.x -= scaler.w;

        /* draw scaler */
        {const struct nk_style_item *item = &style->window.scaler;
        if (item->type == NK_STYLE_ITEM_IMAGE)
            nk_draw_image(out, scaler, &item->data.image, nk_white);
        else {
            if (layout->flags & NK_WINDOW_SCALE_LEFT) {
                nk_fill_triangle(out, scaler.x, scaler.y, scaler.x,
                    scaler.y + scaler.h, scaler.x + scaler.w,
                    scaler.y + scaler.h, item->data.color);
            } else {
                nk_fill_triangle(out, scaler.x + scaler.w, scaler.y, scaler.x + scaler.w,
                    scaler.y + scaler.h, scaler.x, scaler.y + scaler.h, item->data.color);
            }
        }}

        /* do window scaling */
        if (!(window->flags & NK_WINDOW_ROM)) {
            struct nk_vec2 window_size = style->window.min_size;
            int left_mouse_down = in->mouse.buttons[NK_BUTTON_LEFT].down;
            int left_mouse_click_in_scaler = nk_input_has_mouse_click_down_in_rect(in,
                    NK_BUTTON_LEFT, scaler, nk_true);

            if (left_mouse_down && left_mouse_click_in_scaler) {
                float delta_x = in->mouse.delta.x;
                if (layout->flags & NK_WINDOW_SCALE_LEFT) {
                    delta_x = -delta_x;
                    window->bounds.x += in->mouse.delta.x;
                }
                /* dragging in x-direction  */
                if (window->bounds.w + delta_x >= window_size.x) {
                    if ((delta_x < 0) || (delta_x > 0 && in->mouse.pos.x >= scaler.x)) {
                        window->bounds.w = window->bounds.w + delta_x;
                        scaler.x += in->mouse.delta.x;
                    }
                }
                /* dragging in y-direction (only possible if static window) */
                if (!(layout->flags & NK_WINDOW_DYNAMIC)) {
                    if (window_size.y < window->bounds.h + in->mouse.delta.y) {
                        if ((in->mouse.delta.y < 0) || (in->mouse.delta.y > 0 && in->mouse.pos.y >= scaler.y)) {
                            window->bounds.h = window->bounds.h + in->mouse.delta.y;
                            scaler.y += in->mouse.delta.y;
                        }
                    }
                }
                ctx->style.cursor_active = ctx->style.cursors[NK_CURSOR_RESIZE_TOP_RIGHT_DOWN_LEFT];
                in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.x = scaler.x + scaler.w/2.0f;
                in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.y = scaler.y + scaler.h/2.0f;
            }
        }
    }
    if (!nk_panel_is_sub(layout->type)) {
        /* window is hidden so clear command buffer  */
        if (layout->flags & NK_WINDOW_HIDDEN)
            nk_command_buffer_reset(&window->buffer);
        /* window is visible and not tab */
        else nk_finish(ctx, window);
    }

    /* NK_WINDOW_REMOVE_ROM flag was set so remove NK_WINDOW_ROM */
    if (layout->flags & NK_WINDOW_REMOVE_ROM) {
        layout->flags &= ~(nk_flags)NK_WINDOW_ROM;
        layout->flags &= ~(nk_flags)NK_WINDOW_REMOVE_ROM;
    }
    window->flags = layout->flags;

    /* property garbage collector */
    if (window->property.active && window->property.old != window->property.seq &&
        window->property.active == window->property.prev) {
        nk_zero(&window->property, sizeof(window->property));
    } else {
        window->property.old = window->property.seq;
        window->property.prev = window->property.active;
        window->property.seq = 0;
    }
    /* edit garbage collector */
    if (window->edit.active && window->edit.old != window->edit.seq &&
       window->edit.active == window->edit.prev) {
        nk_zero(&window->edit, sizeof(window->edit));
    } else {
        window->edit.old = window->edit.seq;
        window->edit.prev = window->edit.active;
        window->edit.seq = 0;
    }
    /* contextual garbage collector */
    if (window->popup.active_con && window->popup.con_old != window->popup.con_count) {
        window->popup.con_count = 0;
        window->popup.con_old = 0;
        window->popup.active_con = 0;
    } else {
        window->popup.con_old = window->popup.con_count;
        window->popup.con_count = 0;
    }
    window->popup.combo_count = 0;
    /* helper to make sure you have a 'nk_tree_push' for every 'nk_tree_pop' */
    NK_ASSERT(!layout->row.tree_depth);
}